

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_strip(char *str)

{
  size_t sVar1;
  char *accept;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char *in_RDI;
  int nl;
  size_t len;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar6;
  long local_10;
  
  iVar6 = 0;
  sVar1 = strspn(in_RDI," \t");
  accept = in_RDI + sVar1;
  sVar2 = strlen(in_RDI);
  memmove(in_RDI,accept,(sVar2 - sVar1) + 1);
  pcVar3 = strchr(in_RDI,10);
  if (pcVar3 != (char *)0x0) {
    iVar6 = 1;
  }
  sVar4 = zt_cstr_rspn((char *)CONCAT44(iVar6,in_stack_ffffffffffffffe8),accept);
  sVar1 = strlen(in_RDI);
  lVar5 = sVar1 - sVar4;
  if (lVar5 != 0) {
    local_10 = lVar5;
    if (iVar6 != 0) {
      local_10 = lVar5 + 1;
      in_RDI[lVar5] = '\n';
    }
    in_RDI[local_10] = '\0';
  }
  return in_RDI;
}

Assistant:

char*
zt_cstr_strip(char *str) {
    zt_assert(str);
    {
        /* strip whitespace from the beginning of the string */
        size_t    len = 0;
        int       nl  = 0;

        len = strspn(str, WHITESPACE);
        memmove(str, &str[len], (strlen(str) - len) + 1); /* +1 captures \0 */

        /* strip whitespace from the end of the string */
        if (strchr(str, '\n') != NULL) {
            nl = 1;
        }
        len = zt_cstr_rspn(str, WHITESPACE "\n");
        len = strlen(str) - len;
        if (len) {
            if (nl) {
                str[len++] = '\n';
            }
            str[len] = '\0';
        }
    }
    return str;
}